

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::GetColorCode_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this,Color color)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->OutputColorCode == true) {
    std::__cxx11::to_string(&local_30,color);
    std::operator+(&local_50,"\x1b[0;",&local_30);
    std::operator+(__return_storage_ptr__,&local_50,"m");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetColorCode(Color color) const
{
  if (this->Impl->OutputColorCode) {
    return "\033[0;" + std::to_string(static_cast<int>(color)) + "m";
  }

  return "";
}